

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::doRun
          (ExplicitUniformLocationCaseBase *this,
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          *subroutineUniforms)

{
  pointer subroutineUniforms_00;
  size_type sVar1;
  long lVar2;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  noUniforms;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  *subroutineUniforms_local;
  ExplicitUniformLocationCaseBase *this_local;
  
  noUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)subroutineUniforms;
  sVar1 = std::
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          ::size(subroutineUniforms);
  if (sVar1 != 0) {
    std::
    vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              *)local_30);
    subroutineUniforms_00 =
         noUniforms.
         super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    lVar2 = doRun(this,(vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                        *)local_30,
                  (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                   *)subroutineUniforms_00,&local_50,false,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    std::
    vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_30);
    return lVar2;
  }
  __assert_fail("subroutineUniforms.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x7f8,
                "long glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::doRun(std::vector<SubroutineUniform> &)"
               );
}

Assistant:

long doRun(std::vector<SubroutineUniform>& subroutineUniforms)
	{
		assert(subroutineUniforms.size());
		std::vector<Uniform> noUniforms;
		return doRun(noUniforms, subroutineUniforms);
	}